

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void blake2b224_test(void *key,int len,uint32_t seed,void *out)

{
  blake2b_init(&ltc_state,0x1c,(uchar *)0x0,0);
  ltc_state.chc.length = (ulong)seed ^ 0x6a09e667f3bcc908;
  blake2b_process(&ltc_state,(uchar *)key,(long)len);
  blake2b_done(&ltc_state,(uchar *)out);
  return;
}

Assistant:

inline void blake2b224_test(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  blake2b_init(&ltc_state, 28, NULL, 0);
  ltc_state.blake2b.h[0] = CONST64(0x6a09e667f3bcc908) ^ seed;
  blake2b_process(&ltc_state, (unsigned char *)key, len);
  blake2b_done(&ltc_state, (unsigned char *)out);
}